

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O1

int ARKodeGetResWeights(void *arkode_mem,N_Vector rweight)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar1 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    line = 0x9f3;
  }
  else {
    if (*(int *)((long)arkode_mem + 0x200) != 0) {
      N_VScale(0x3ff0000000000000,*(undefined8 *)((long)arkode_mem + 0x238));
      return 0;
    }
    msgfmt = "time-stepping module does not support non-identity mass matrices";
    iVar1 = -0x30;
    error_code = -0x30;
    line = 0x9fc;
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,line,"ARKodeGetResWeights",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                  ,msgfmt);
  return iVar1;
}

Assistant:

int ARKodeGetResWeights(void* arkode_mem, N_Vector rweight)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not support mass matrices */
  if (!ark_mem->step_supports_massmatrix)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support non-identity mass matrices");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  N_VScale(ONE, ark_mem->rwt, rweight);
  return (ARK_SUCCESS);
}